

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

State __thiscall TileWire::checkOutput(TileWire *this,Direction direction)

{
  byte *pbVar1;
  bool *exitDirections;
  Direction direction_local;
  TileWire *this_local;
  State local_4;
  
  pbVar1 = &(&this->super_Tile)[(long)(int)(this->super_Tile)._direction * 2].field_0x21 +
           (long)(int)direction * 4 + (long)(int)this->_type * 0x10;
  if (((((*pbVar1 & 1) == 0) && ((pbVar1[1] & 1) == 0)) && ((pbVar1[2] & 1) == 0)) &&
     ((pbVar1[3] & 1) == 0)) {
    local_4 = DISCONNECTED;
  }
  else if ((this->_type == CROSSOVER) && ((int)direction % 2 == 1)) {
    local_4 = this->_state2;
  }
  else {
    local_4 = this->_state1;
  }
  return local_4;
}

Assistant:

State TileWire::checkOutput(Direction direction) const {
    const bool* exitDirections = CONNECTION_INFO[_direction][_type][direction];
    if (exitDirections[0] || exitDirections[1] || exitDirections[2] || exitDirections[3]) {
        if (_type == CROSSOVER && direction % 2 == 1) {
            return _state2;
        } else {
            return _state1;
        }
    } else {
        return DISCONNECTED;
    }
}